

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map_array_suite.cpp
# Opt level: O3

void api_suite::api_erase_key(void)

{
  key_type local_7c;
  size_type local_78;
  undefined4 local_6c;
  map_array<int,_int,_4UL,_std::less<int>_> local_68;
  
  local_68.super_map_view<int,_int,_4UL,_std::less<int>_>.member.tail =
       local_68.super_array<vista::pair<int,_int>,_4UL>._M_elems + 1;
  local_68.super_array<vista::pair<int,_int>,_4UL>._M_elems[1].first = 0;
  local_68.super_array<vista::pair<int,_int>,_4UL>._M_elems[1].second = 0;
  local_68.super_array<vista::pair<int,_int>,_4UL>._M_elems[2].first = 0;
  local_68.super_array<vista::pair<int,_int>,_4UL>._M_elems[2].second = 0;
  local_68.super_array<vista::pair<int,_int>,_4UL>._M_elems[3].first = 0;
  local_68.super_array<vista::pair<int,_int>,_4UL>._M_elems[3].second = 0;
  local_68.super_map_view<int,_int,_4UL,_std::less<int>_>.super_span<vista::pair<int,_int>,_4UL>.
  member.tail = (pointer)&local_68.super_map_view<int,_int,_4UL,_std::less<int>_>;
  local_68.super_array<vista::pair<int,_int>,_4UL>._M_elems[0].first = 0xb;
  local_68.super_array<vista::pair<int,_int>,_4UL>._M_elems[0].second = 1;
  local_78 = 1;
  local_7c = 1;
  local_68.super_map_view<int,_int,_4UL,_std::less<int>_>.super_span<vista::pair<int,_int>,_4UL>.
  member.head = (pointer)&local_68;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_long,int>
            ("array.size()","1",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/map_array_suite.cpp"
             ,0x72,"void api_suite::api_erase_key()",&local_78,&local_7c);
  local_7c = 0xb;
  local_78 = vista::map_array<int,_int,_4UL,_std::less<int>_>::erase(&local_68,&local_7c);
  local_6c = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_long,int>
            ("array.erase(11)","1",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/map_array_suite.cpp"
             ,0x73,"void api_suite::api_erase_key()",&local_78,&local_6c);
  local_78 = (long)local_68.super_map_view<int,_int,_4UL,_std::less<int>_>.member.tail -
             (long)local_68.super_map_view<int,_int,_4UL,_std::less<int>_>.
                   super_span<vista::pair<int,_int>,_4UL>.member.head >> 3;
  local_7c = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_long,int>
            ("array.size()","0",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/map_array_suite.cpp"
             ,0x74,"void api_suite::api_erase_key()",&local_78,&local_7c);
  return;
}

Assistant:

void api_ctor_default()
{
    map_array<int, int, 4> array;
    BOOST_TEST_EQ(array.size(), 0);
    BOOST_TEST_EQ(array.capacity(), 4);
}